

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# reduction.cpp
# Opt level: O0

float ncnn::reduction(float v0,float *ptr,int size,int op_type)

{
  int in_EDX;
  undefined8 in_RDI;
  float in_XMM0_Da;
  int size_00;
  undefined4 in_stack_fffffffffffffffc;
  
  size_00 = (int)((ulong)in_RDI >> 0x20);
  if (in_EDX == 0) {
    in_XMM0_Da = reduction<ncnn::reduction_op_add>
                           ((float)size,(float *)CONCAT44(in_stack_fffffffffffffffc,in_XMM0_Da),
                            size_00);
  }
  else if (in_EDX == 1) {
    in_XMM0_Da = reduction<ncnn::reduction_op_asum>
                           ((float)size,(float *)CONCAT44(in_stack_fffffffffffffffc,in_XMM0_Da),
                            size_00);
  }
  else if (in_EDX == 2) {
    in_XMM0_Da = reduction<ncnn::reduction_op_sumsq>
                           ((float)size,(float *)CONCAT44(in_stack_fffffffffffffffc,in_XMM0_Da),
                            size_00);
  }
  else if (in_EDX == 6) {
    in_XMM0_Da = reduction<ncnn::reduction_op_mul>
                           ((float)size,(float *)CONCAT44(in_stack_fffffffffffffffc,in_XMM0_Da),
                            size_00);
  }
  else if (in_EDX == 4) {
    in_XMM0_Da = reduction<ncnn::reduction_op_max>
                           ((float)size,(float *)CONCAT44(in_stack_fffffffffffffffc,in_XMM0_Da),
                            size_00);
  }
  else if (in_EDX == 5) {
    in_XMM0_Da = reduction<ncnn::reduction_op_min>
                           ((float)size,(float *)CONCAT44(in_stack_fffffffffffffffc,in_XMM0_Da),
                            size_00);
  }
  else if (in_EDX == 10) {
    in_XMM0_Da = reduction<ncnn::reduction_op_sumexp>
                           ((float)size,(float *)CONCAT44(in_stack_fffffffffffffffc,in_XMM0_Da),
                            size_00);
  }
  return in_XMM0_Da;
}

Assistant:

static float reduction(float v0, const float* ptr, int size, int op_type)
{
    if (op_type == Reduction::ReductionOp_SUM) return reduction<reduction_op_add>(v0, ptr, size);
    if (op_type == Reduction::ReductionOp_ASUM) return reduction<reduction_op_asum>(v0, ptr, size);
    if (op_type == Reduction::ReductionOp_SUMSQ) return reduction<reduction_op_sumsq>(v0, ptr, size);
    if (op_type == Reduction::ReductionOp_PROD) return reduction<reduction_op_mul>(v0, ptr, size);
    if (op_type == Reduction::ReductionOp_MAX) return reduction<reduction_op_max>(v0, ptr, size);
    if (op_type == Reduction::ReductionOp_MIN) return reduction<reduction_op_min>(v0, ptr, size);
    if (op_type == Reduction::ReductionOp_LogSumExp) return reduction<reduction_op_sumexp>(v0, ptr, size);

    // should never reach here
    return v0;
}